

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lex.hpp
# Opt level: O2

bool __thiscall
cfgfile::lexical_analyzer_t<cfgfile::qstring_trait_t>::is_space_char
          (lexical_analyzer_t<cfgfile::qstring_trait_t> *this,char_t ch)

{
  bool bVar1;
  
  bVar1 = true;
  if (((const_t<cfgfile::qstring_trait_t>::c_space != ch.ucs) &&
      (const_t<cfgfile::qstring_trait_t>::c_tab != ch.ucs)) &&
     (const_t<cfgfile::qstring_trait_t>::c_carriage_return != ch.ucs)) {
    bVar1 = const_t<cfgfile::qstring_trait_t>::c_line_feed == ch.ucs;
  }
  return bVar1;
}

Assistant:

bool is_space_char( typename Trait::char_t ch )
	{
		if( ch == const_t< Trait >::c_space || ch == const_t< Trait >::c_tab ||
			ch == const_t< Trait >::c_carriage_return ||
			ch == const_t< Trait >::c_line_feed )
				return true;
		else
			return false;
	}